

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O2

boolean empty_mem_output_buffer(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  _func_void_j_compress_ptr *__size;
  _func_boolean_j_compress_ptr *__dest;
  _func_void_j_compress_ptr *p_Var2;
  
  pjVar1 = cinfo->dest;
  p_Var2 = pjVar1[1].term_destination;
  __size = (_func_void_j_compress_ptr *)((long)p_Var2 * 2);
  __dest = (_func_boolean_j_compress_ptr *)malloc((size_t)__size);
  if (__dest == (_func_boolean_j_compress_ptr *)0x0) {
    *(undefined8 *)&cinfo->err->msg_code = 0xa00000038;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    p_Var2 = pjVar1[1].term_destination;
  }
  memcpy(__dest,pjVar1[1].empty_output_buffer,(size_t)p_Var2);
  free(pjVar1[1].init_destination);
  pjVar1[1].init_destination = (_func_void_j_compress_ptr *)__dest;
  p_Var2 = pjVar1[1].term_destination;
  pjVar1->next_output_byte = (JOCTET *)(__dest + (long)p_Var2);
  pjVar1->free_in_buffer = (size_t)p_Var2;
  pjVar1[1].empty_output_buffer = __dest;
  pjVar1[1].term_destination = __size;
  return 1;
}

Assistant:

METHODDEF(boolean)
empty_mem_output_buffer (j_compress_ptr cinfo)
{
  size_t nextsize;
  JOCTET * nextbuffer;
  my_mem_dest_ptr dest = (my_mem_dest_ptr) cinfo->dest;

  /* Try to allocate new buffer with double size */
  nextsize = dest->bufsize * 2;
  nextbuffer = (JOCTET *) malloc(nextsize);

  if (nextbuffer == NULL)
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);

  MEMCOPY(nextbuffer, dest->buffer, dest->bufsize);

  if (dest->newbuffer != NULL)
    free(dest->newbuffer);

  dest->newbuffer = nextbuffer;

  dest->pub.next_output_byte = nextbuffer + dest->bufsize;
  dest->pub.free_in_buffer = dest->bufsize;

  dest->buffer = nextbuffer;
  dest->bufsize = nextsize;

  return TRUE;
}